

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

void cvAdjustOrder(CVodeMem cv_mem,int deltaq)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  sunrealtype *psVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  N_Vector *pp_Var7;
  long lVar8;
  long lVar9;
  sunrealtype *psVar10;
  N_Vector **ppp_Var11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  sunrealtype sVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  uVar3 = cv_mem->cv_q;
  uVar15 = (ulong)uVar3;
  if (deltaq == 1 || uVar15 != 2) {
    if (cv_mem->cv_lmm == 2) {
      if (deltaq == -1) {
        if (-1 < cv_mem->cv_qmax) {
          memset(cv_mem->cv_l,0,(ulong)(uint)cv_mem->cv_qmax * 8 + 8);
        }
        cv_mem->cv_l[2] = 1.0;
        if (2 < (int)uVar3) {
          dVar2 = cv_mem->cv_hscale;
          dVar17 = 0.0;
          uVar6 = 1;
          lVar9 = 0x9a;
          do {
            dVar17 = dVar17 + cv_mem->cv_tau[uVar6];
            lVar8 = lVar9;
            do {
              (&cv_mem->cv_sunctx)[lVar8] =
                   (SUNContext)
                   ((double)(&cv_mem->cv_sunctx)[lVar8] * (dVar17 / dVar2) +
                   cv_mem->cv_l[(int)lVar8 - 0x98]);
              lVar13 = lVar8 + -0x97;
              lVar8 = lVar8 + -1;
            } while (2 < lVar13);
            uVar6 = uVar6 + 1;
            lVar9 = lVar9 + 1;
          } while (uVar6 != uVar3 - 1);
        }
        if (2 < (int)uVar3) {
          psVar10 = cv_mem->cv_cvals;
          lVar9 = 0;
          do {
            psVar10[lVar9] = -cv_mem->cv_l[lVar9 + 2];
            lVar9 = lVar9 + 1;
          } while (uVar15 - 2 != lVar9);
          N_VScaleAddMulti(uVar3 - 2,psVar10,cv_mem->cv_zn[uVar15],cv_mem->cv_zn + 2,
                           cv_mem->cv_zn + 2);
          if (cv_mem->cv_quadr != 0) {
            N_VScaleAddMulti(cv_mem->cv_q + -2,cv_mem->cv_cvals,cv_mem->cv_znQ[cv_mem->cv_q],
                             cv_mem->cv_znQ + 2,cv_mem->cv_znQ + 2);
          }
          if (cv_mem->cv_sensi != 0) {
            N_VScaleAddMultiVectorArray
                      (cv_mem->cv_Ns,cv_mem->cv_q + -2,cv_mem->cv_cvals,cv_mem->cv_znS[cv_mem->cv_q]
                       ,cv_mem->cv_znS + 2,cv_mem->cv_znS + 2);
          }
          if (cv_mem->cv_quadr_sensi != 0) {
            iVar14 = cv_mem->cv_Ns;
            iVar12 = cv_mem->cv_q + -2;
            psVar10 = cv_mem->cv_cvals;
            pp_Var7 = cv_mem->cv_znQS[cv_mem->cv_q];
            ppp_Var11 = cv_mem->cv_znQS + 2;
LAB_00120a3c:
            N_VScaleAddMultiVectorArray(iVar14,iVar12,psVar10,pp_Var7,ppp_Var11,ppp_Var11);
            return;
          }
        }
      }
      else if (deltaq == 1) {
        if (-1 < cv_mem->cv_qmax) {
          memset(cv_mem->cv_l,0,(ulong)(uint)cv_mem->cv_qmax * 8 + 8);
        }
        cv_mem->cv_l[2] = 1.0;
        if ((int)uVar3 < 2) {
          dVar2 = -1.0;
          dVar17 = 1.0;
          dVar16 = 1.0;
        }
        else {
          dVar1 = cv_mem->cv_hscale;
          dVar2 = -1.0;
          uVar6 = 1;
          lVar9 = 0x9a;
          dVar20 = 1.0;
          dVar16 = 1.0;
          dVar17 = 1.0;
          dVar19 = dVar1;
          do {
            dVar19 = dVar19 + cv_mem->cv_tau[uVar6 + 1];
            uVar6 = uVar6 + 1;
            lVar8 = lVar9;
            do {
              (&cv_mem->cv_sunctx)[lVar8] =
                   (SUNContext)
                   ((double)(&cv_mem->cv_sunctx)[lVar8] * dVar20 + cv_mem->cv_l[(int)lVar8 - 0x98]);
              lVar8 = lVar8 + -1;
            } while (2 < (int)lVar8 + -0x96);
            dVar20 = dVar19 / dVar1;
            dVar16 = dVar16 + 1.0 / dVar20;
            dVar17 = dVar17 * dVar20;
            dVar2 = dVar2 - 1.0 / (double)(int)uVar6;
            lVar9 = lVar9 + 1;
          } while (uVar6 != uVar15);
        }
        psVar10 = cv_mem->cv_l + 2;
        dVar17 = ((double)((ulong)dVar2 ^ (ulong)DAT_00138020) - dVar16) / dVar17;
        N_VScale(cv_mem->cv_zn[cv_mem->cv_indx_acor],cv_mem->cv_zn[cv_mem->cv_L]);
        if (1 < cv_mem->cv_q) {
          N_VScaleAddMulti(cv_mem->cv_q + -1,psVar10,cv_mem->cv_zn[cv_mem->cv_L],cv_mem->cv_zn + 2,
                           cv_mem->cv_zn + 2);
        }
        if (cv_mem->cv_quadr != 0) {
          N_VScale(cv_mem->cv_znQ[cv_mem->cv_indx_acor],cv_mem->cv_znQ[cv_mem->cv_L]);
          if (1 < cv_mem->cv_q) {
            N_VScaleAddMulti(cv_mem->cv_q + -1,psVar10,cv_mem->cv_znQ[cv_mem->cv_L],
                             cv_mem->cv_znQ + 2,cv_mem->cv_znQ + 2);
          }
        }
        auVar5 = _DAT_00138040;
        if (cv_mem->cv_sensi != 0) {
          iVar14 = cv_mem->cv_Ns;
          lVar9 = (long)iVar14;
          if (0 < lVar9) {
            psVar4 = cv_mem->cv_cvals;
            lVar8 = lVar9 + -1;
            auVar23._8_4_ = (int)lVar8;
            auVar23._0_8_ = lVar8;
            auVar23._12_4_ = (int)((ulong)lVar8 >> 0x20);
            lVar8 = 0;
            auVar23 = auVar23 ^ _DAT_00138040;
            auVar22 = _DAT_00138030;
            do {
              auVar21 = auVar22 ^ auVar5;
              if ((bool)(~(auVar21._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar21._0_4_ ||
                          auVar23._4_4_ < auVar21._4_4_) & 1)) {
                *(double *)((long)psVar4 + lVar8) = dVar17;
              }
              if ((auVar21._12_4_ != auVar23._12_4_ || auVar21._8_4_ <= auVar23._8_4_) &&
                  auVar21._12_4_ <= auVar23._12_4_) {
                *(double *)((long)psVar4 + lVar8 + 8) = dVar17;
              }
              lVar13 = auVar22._8_8_;
              auVar22._0_8_ = auVar22._0_8_ + 2;
              auVar22._8_8_ = lVar13 + 2;
              lVar8 = lVar8 + 0x10;
            } while ((ulong)(iVar14 + 1U >> 1) << 4 != lVar8);
          }
          N_VScaleVectorArray(lVar9,cv_mem->cv_cvals,cv_mem->cv_znS[cv_mem->cv_indx_acor],
                              cv_mem->cv_znS[cv_mem->cv_L]);
          if (1 < cv_mem->cv_q) {
            N_VScaleAddMultiVectorArray
                      (cv_mem->cv_Ns,cv_mem->cv_q + -1,psVar10,cv_mem->cv_znS[cv_mem->cv_L],
                       cv_mem->cv_znS + 2,cv_mem->cv_znS + 2);
          }
        }
        auVar5 = _DAT_00138040;
        if (cv_mem->cv_quadr_sensi != 0) {
          iVar14 = cv_mem->cv_Ns;
          lVar9 = (long)iVar14;
          if (0 < lVar9) {
            psVar4 = cv_mem->cv_cvals;
            lVar8 = lVar9 + -1;
            auVar24._8_4_ = (int)lVar8;
            auVar24._0_8_ = lVar8;
            auVar24._12_4_ = (int)((ulong)lVar8 >> 0x20);
            lVar8 = 0;
            auVar24 = auVar24 ^ _DAT_00138040;
            auVar21 = _DAT_00138030;
            do {
              auVar22 = auVar21 ^ auVar5;
              if ((bool)(~(auVar22._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar22._0_4_ ||
                          auVar24._4_4_ < auVar22._4_4_) & 1)) {
                *(double *)((long)psVar4 + lVar8) = dVar17;
              }
              if ((auVar22._12_4_ != auVar24._12_4_ || auVar22._8_4_ <= auVar24._8_4_) &&
                  auVar22._12_4_ <= auVar24._12_4_) {
                *(double *)((long)psVar4 + lVar8 + 8) = dVar17;
              }
              lVar13 = auVar21._8_8_;
              auVar21._0_8_ = auVar21._0_8_ + 2;
              auVar21._8_8_ = lVar13 + 2;
              lVar8 = lVar8 + 0x10;
            } while ((ulong)(iVar14 + 1U >> 1) << 4 != lVar8);
          }
          N_VScaleVectorArray(lVar9,cv_mem->cv_cvals,cv_mem->cv_znQS[cv_mem->cv_indx_acor],
                              cv_mem->cv_znQS[cv_mem->cv_L]);
          if (1 < cv_mem->cv_q) {
            iVar14 = cv_mem->cv_Ns;
            iVar12 = cv_mem->cv_q + -1;
            pp_Var7 = cv_mem->cv_znQS[cv_mem->cv_L];
            ppp_Var11 = cv_mem->cv_znQS + 2;
            goto LAB_00120a3c;
          }
        }
      }
    }
    else if (cv_mem->cv_lmm == 1) {
      if (deltaq == 1) {
        N_VConst(0,cv_mem->cv_zn[cv_mem->cv_L]);
        if (cv_mem->cv_quadr != 0) {
          N_VConst(0,cv_mem->cv_znQ[cv_mem->cv_L]);
        }
        if (cv_mem->cv_sensi != 0) {
          N_VConstVectorArray(0,cv_mem->cv_Ns,cv_mem->cv_znS[cv_mem->cv_L]);
          return;
        }
      }
      else {
        if (-1 < cv_mem->cv_qmax) {
          memset(cv_mem->cv_l,0,(ulong)(uint)cv_mem->cv_qmax * 8 + 8);
        }
        cv_mem->cv_l[1] = 1.0;
        if (2 < (int)uVar3) {
          dVar2 = cv_mem->cv_hscale;
          dVar17 = 0.0;
          uVar6 = 1;
          lVar9 = 0x99;
          do {
            dVar17 = dVar17 + cv_mem->cv_tau[uVar6];
            lVar8 = lVar9;
            do {
              (&cv_mem->cv_sunctx)[lVar8] =
                   (SUNContext)
                   ((double)(&cv_mem->cv_sunctx)[lVar8] * (dVar17 / dVar2) +
                   cv_mem->cv_l[(int)lVar8 - 0x98]);
              lVar13 = lVar8 + -0x97;
              lVar8 = lVar8 + -1;
            } while (1 < lVar13);
            uVar6 = uVar6 + 1;
            lVar9 = lVar9 + 1;
          } while (uVar6 != uVar3 - 1);
          if (2 < (int)uVar3) {
            sVar18 = cv_mem->cv_l[1];
            lVar9 = 0;
            do {
              sVar18 = (sVar18 / (double)((int)lVar9 + 2)) * (double)(int)uVar3;
              cv_mem->cv_l[lVar9 + 2] = sVar18;
              lVar9 = lVar9 + 1;
            } while ((ulong)(uVar3 - 1) - 1 != lVar9);
          }
        }
        if (2 < (int)uVar3) {
          psVar10 = cv_mem->cv_cvals;
          lVar9 = 0;
          do {
            psVar10[lVar9] = -cv_mem->cv_l[lVar9 + 2];
            lVar9 = lVar9 + 1;
          } while (uVar15 - 2 != lVar9);
          N_VScaleAddMulti(uVar3 - 2,psVar10,cv_mem->cv_zn[uVar15],cv_mem->cv_zn + 2,
                           cv_mem->cv_zn + 2);
          if (cv_mem->cv_quadr != 0) {
            N_VScaleAddMulti(cv_mem->cv_q + -2,cv_mem->cv_cvals,cv_mem->cv_znQ[cv_mem->cv_q],
                             cv_mem->cv_znQ + 2,cv_mem->cv_znQ + 2);
          }
          if (cv_mem->cv_sensi != 0) {
            iVar14 = cv_mem->cv_Ns;
            iVar12 = cv_mem->cv_q + -2;
            psVar10 = cv_mem->cv_cvals;
            pp_Var7 = cv_mem->cv_znS[cv_mem->cv_q];
            ppp_Var11 = cv_mem->cv_znS + 2;
            goto LAB_00120a3c;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void cvAdjustOrder(CVodeMem cv_mem, int deltaq)
{
  if ((cv_mem->cv_q == 2) && (deltaq != 1)) { return; }

  switch (cv_mem->cv_lmm)
  {
  case CV_ADAMS: cvAdjustAdams(cv_mem, deltaq); break;
  case CV_BDF: cvAdjustBDF(cv_mem, deltaq); break;
  }
}